

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

int mapApproxHeight(float *y,int *ids,Generator *g,SurfaceNoise *sn,int x,int z,int w,int h)

{
  Range r_00;
  int iVar1;
  int iVar2;
  void *__ptr;
  int *__ptr_00;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  double dVar3;
  SurfaceNoise *sn_00;
  OctaveNoise *pOVar4;
  int in_stack_00000008;
  int in_stack_00000010;
  double dy;
  double fall;
  double n0;
  int py;
  int k;
  double v [2];
  int ymax;
  int ymin;
  int ytest;
  double vmax;
  double vmin;
  double off;
  int pz;
  int px;
  float weight;
  int id_1;
  double s;
  double d;
  int id0;
  double wd;
  double ws;
  double wt;
  double s0;
  double d0;
  int *cache;
  Range r;
  int jj;
  int ii;
  int64_t j;
  int64_t i;
  double *scale;
  double *depth;
  float biome_kernel [25];
  int samplez;
  int samplex;
  int64_t j_2;
  int64_t i_2;
  SurfaceNoiseBeta snb;
  int id;
  int64_t np [6];
  int flags;
  int64_t j_1;
  int64_t i_1;
  uint64_t in_stack_ffffffffffffaaf8;
  SurfaceNoiseBeta *in_stack_ffffffffffffab00;
  undefined4 in_stack_ffffffffffffab14;
  undefined8 in_stack_ffffffffffffab18;
  undefined8 in_stack_ffffffffffffab20;
  int in_stack_ffffffffffffab28;
  int in_stack_ffffffffffffab44;
  double in_stack_ffffffffffffab48;
  int in_stack_ffffffffffffab50;
  int in_stack_ffffffffffffab54;
  SurfaceNoiseBeta *in_stack_ffffffffffffab58;
  undefined4 in_stack_ffffffffffffab60;
  int in_stack_ffffffffffffab64;
  int in_stack_ffffffffffffab68;
  int in_stack_ffffffffffffab6c;
  OctaveNoise *in_stack_ffffffffffffab70;
  OctaveNoise *pOVar5;
  float local_5470;
  uint64_t *in_stack_ffffffffffffab98;
  undefined4 local_5460;
  int in_stack_ffffffffffffaba4;
  int in_stack_ffffffffffffaba8;
  int in_stack_ffffffffffffabac;
  int64_t *in_stack_ffffffffffffabb0;
  double dVar6;
  BiomeNoise *in_stack_ffffffffffffabb8;
  EndNoise *in_stack_ffffffffffffabc0;
  double dVar7;
  float *in_stack_ffffffffffffabc8;
  uint32_t in_stack_ffffffffffffabd0;
  undefined4 uStack_542c;
  int local_5400;
  int local_53fc;
  long local_53f8;
  long local_53f0;
  float local_53d8 [2];
  int in_stack_ffffffffffffac30;
  int in_stack_ffffffffffffac38;
  int in_stack_ffffffffffffac40;
  long local_5360;
  long local_5358;
  int *in_stack_fffffffffffffe10;
  Generator *in_stack_fffffffffffffe18;
  Range in_stack_fffffffffffffe30;
  long local_58;
  long local_40;
  long local_38;
  int local_4;
  
  if (in_RDX[1] == -1) {
    local_4 = 0x7f;
  }
  else if (in_RDX[1] == 1) {
    if (*in_RDX < 0xc) {
      local_4 = 1;
    }
    else {
      local_4 = mapEndSurfaceHeight(in_stack_ffffffffffffabc8,in_stack_ffffffffffffabc0,
                                    (SurfaceNoise *)in_stack_ffffffffffffabb8,
                                    (int)((ulong)in_stack_ffffffffffffabb0 >> 0x20),
                                    (int)in_stack_ffffffffffffabb0,in_stack_ffffffffffffabac,
                                    in_stack_ffffffffffffac30,in_stack_ffffffffffffac38,
                                    in_stack_ffffffffffffac40);
    }
  }
  else if (*in_RDX < 0x16) {
    if (*in_RDX < 2) {
      initSurfaceNoiseBeta(in_stack_ffffffffffffab00,in_stack_ffffffffffffaaf8);
      for (local_5360 = 0; local_5360 < in_stack_00000010; local_5360 = local_5360 + 1) {
        for (local_5358 = 0; local_5358 < in_stack_00000008; local_5358 = local_5358 + 1) {
          dVar3 = approxSurfaceBeta((BiomeNoiseBeta *)
                                    CONCAT44(in_stack_ffffffffffffab64,in_stack_ffffffffffffab60),
                                    in_stack_ffffffffffffab58,in_stack_ffffffffffffab54,
                                    in_stack_ffffffffffffab50);
          *(float *)(in_RDI + (local_5360 * in_stack_00000008 + local_5358) * 4) = (float)dVar3;
        }
      }
      local_4 = 0;
    }
    else {
      memcpy(local_53d8,&DAT_00140330,100);
      __ptr = malloc((long)in_stack_00000008 * 0x10 * (long)in_stack_00000010);
      iVar1 = in_stack_00000008 * in_stack_00000010;
      r_00.x = in_stack_ffffffffffffab14;
      r_00.scale = 1;
      r_00.z = (int)in_stack_ffffffffffffab18;
      r_00.sx = (int)((ulong)in_stack_ffffffffffffab18 >> 0x20);
      r_00.sz = (int)in_stack_ffffffffffffab20;
      r_00.y = (int)((ulong)in_stack_ffffffffffffab20 >> 0x20);
      r_00.sy = in_stack_ffffffffffffab28;
      __ptr_00 = allocCache((Generator *)CONCAT44(in_R8D + -2,4),r_00);
      genBiomes(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe30);
      for (local_53f8 = 0; local_53f8 < in_stack_00000010; local_53f8 = local_53f8 + 1) {
        for (local_53f0 = 0; local_53f0 < in_stack_00000008; local_53f0 = local_53f0 + 1) {
          dVar7 = 0.0;
          dVar3 = 0.0;
          dVar6 = 0.0;
          iVar2 = __ptr_00[(local_53f8 + 2) * (long)(in_stack_00000008 + 5) + local_53f0 + 2];
          getBiomeDepthAndScale
                    (iVar2,(double *)&stack0xffffffffffffabd0,(double *)&stack0xffffffffffffabc8,
                     (int *)0x0);
          for (local_5400 = 0; local_5400 < 5; local_5400 = local_5400 + 1) {
            for (local_53fc = 0; local_53fc < 5; local_53fc = local_53fc + 1) {
              getBiomeDepthAndScale
                        (__ptr_00[(local_53f8 + local_5400) * (long)(in_stack_00000008 + 5) +
                                  local_53f0 + local_53fc],(double *)&local_5460,
                         (double *)&stack0xffffffffffffab98,(int *)0x0);
              local_5470 = (float)((double)local_53d8[local_5400 * 5 + local_53fc] /
                                  ((double)CONCAT44(in_stack_ffffffffffffaba4,local_5460) + 2.0));
              if ((double)CONCAT44(uStack_542c,in_stack_ffffffffffffabd0) <=
                  (double)CONCAT44(in_stack_ffffffffffffaba4,local_5460) &&
                  (double)CONCAT44(in_stack_ffffffffffffaba4,local_5460) !=
                  (double)CONCAT44(uStack_542c,in_stack_ffffffffffffabd0)) {
                local_5470 = local_5470 * 0.5;
              }
              dVar3 = (double)in_stack_ffffffffffffab98 * (double)local_5470 + dVar3;
              dVar6 = (double)CONCAT44(in_stack_ffffffffffffaba4,local_5460) * (double)local_5470 +
                      dVar6;
              dVar7 = (double)local_5470 + dVar7;
            }
          }
          *(double *)((long)__ptr + (local_53f8 * in_stack_00000008 + local_53f0) * 8) =
               ((((dVar6 / dVar7) * 4.0 + -1.0) / 8.0) * 17.0) / 64.0;
          *(double *)
           ((long)__ptr + (local_53f8 * in_stack_00000008 + local_53f0) * 8 + (long)iVar1 * 8) =
               96.0 / ((dVar3 / dVar7) * 0.9 + 0.1);
          if (in_RSI != 0) {
            *(int *)(in_RSI + (local_53f8 * in_stack_00000008 + local_53f0) * 4) = iVar2;
          }
        }
      }
      free(__ptr_00);
      for (local_53f8 = 0; local_53f8 < in_stack_00000010; local_53f8 = local_53f8 + 1) {
        for (local_53f0 = 0; local_53f0 < in_stack_00000008; local_53f0 = local_53f0 + 1) {
          dVar3 = sampleOctaveAmp(in_stack_ffffffffffffab70,
                                  (double)CONCAT44(in_stack_ffffffffffffab6c,
                                                   in_stack_ffffffffffffab68),
                                  (double)CONCAT44(in_stack_ffffffffffffab64,
                                                   in_stack_ffffffffffffab60),
                                  (double)in_stack_ffffffffffffab58,
                                  (double)CONCAT44(in_stack_ffffffffffffab54,
                                                   in_stack_ffffffffffffab50),
                                  in_stack_ffffffffffffab48,in_stack_ffffffffffffab44);
          dVar3 = dVar3 * 8.191875;
          if (dVar3 < 0.0) {
            dVar3 = dVar3 * -0.3;
          }
          dVar3 = dVar3 * 3.0 + -2.0;
          if (1.0 < dVar3) {
            dVar3 = 1.0;
          }
          dVar3 = dVar3 * 0.265625;
          if (0.0 <= dVar3) {
            sn_00 = (SurfaceNoise *)(dVar3 * 0.025);
          }
          else {
            sn_00 = (SurfaceNoise *)(dVar3 * 0.03571428571428571);
          }
          pOVar5 = (OctaveNoise *)0x0;
          in_stack_ffffffffffffab70 = (OctaveNoise *)0x0;
          in_stack_ffffffffffffab6c = 8;
          in_stack_ffffffffffffab68 = 0;
          in_stack_ffffffffffffab64 = 0x20;
          do {
            for (in_stack_ffffffffffffab44 = 0; in_stack_ffffffffffffab44 < 2;
                in_stack_ffffffffffffab44 = in_stack_ffffffffffffab44 + 1) {
              iVar2 = in_stack_ffffffffffffab6c + in_stack_ffffffffffffab44;
              dVar3 = sampleSurfaceNoise(sn_00,(int)((ulong)pOVar5 >> 0x20),(int)pOVar5,
                                         (int)((ulong)in_stack_ffffffffffffab70 >> 0x20));
              dVar6 = *(double *)
                       ((long)__ptr +
                       (local_53f8 * in_stack_00000008 + local_53f0) * 8 + (long)iVar1 * 8) *
                      ((((1.0 - (double)(iVar2 * 2) / 32.0) + (double)sn_00) - 0.46875) +
                      *(double *)((long)__ptr + (local_53f8 * in_stack_00000008 + local_53f0) * 8));
              if (0.0 < dVar6) {
                dVar6 = dVar6 * 4.0;
              }
              pOVar4 = (OctaveNoise *)(dVar6 + dVar3);
              *(OctaveNoise **)(&stack0xffffffffffffab48 + (long)in_stack_ffffffffffffab44 * 8) =
                   pOVar4;
              if ((0.0 <= (double)pOVar4) && (in_stack_ffffffffffffab68 < iVar2)) {
                in_stack_ffffffffffffab68 = iVar2;
                pOVar5 = pOVar4;
              }
              if (((double)pOVar4 < 0.0) && (iVar2 < in_stack_ffffffffffffab64)) {
                in_stack_ffffffffffffab64 = iVar2;
                in_stack_ffffffffffffab70 = pOVar4;
              }
            }
            dVar3 = in_stack_ffffffffffffab48 /
                    (in_stack_ffffffffffffab48 -
                    (double)CONCAT44(in_stack_ffffffffffffab54,in_stack_ffffffffffffab50));
            if (0.0 < dVar3) {
              dVar3 = ceil(dVar3);
            }
            else {
              dVar3 = floor(dVar3);
            }
            in_stack_ffffffffffffab6c = (int)dVar3 + in_stack_ffffffffffffab6c;
            if (in_stack_ffffffffffffab6c <= in_stack_ffffffffffffab68) {
              in_stack_ffffffffffffab6c = in_stack_ffffffffffffab68 + 1;
            }
            if (in_stack_ffffffffffffab64 <= in_stack_ffffffffffffab6c) {
              in_stack_ffffffffffffab6c = in_stack_ffffffffffffab64 + -1;
            }
          } while (1 < in_stack_ffffffffffffab64 - in_stack_ffffffffffffab68);
          *(float *)(in_RDI + (local_53f8 * in_stack_00000008 + local_53f0) * 4) =
               (float)(((double)pOVar5 / ((double)pOVar5 - (double)in_stack_ffffffffffffab70) +
                       (double)in_stack_ffffffffffffab68) * 8.0);
        }
      }
      free(__ptr);
      local_4 = 0;
    }
  }
  else if ((in_RDX[0x180a] == -1) || (in_RDX[0x180a] == 4)) {
    for (local_40 = 0; local_40 < in_stack_00000010; local_40 = local_40 + 1) {
      for (local_38 = 0; local_38 < in_stack_00000008; local_38 = local_38 + 1) {
        iVar1 = sampleBiomeNoise(in_stack_ffffffffffffabb8,in_stack_ffffffffffffabb0,
                                 in_stack_ffffffffffffabac,in_stack_ffffffffffffaba8,
                                 in_stack_ffffffffffffaba4,in_stack_ffffffffffffab98,
                                 in_stack_ffffffffffffabd0);
        if (in_RSI != 0) {
          *(int *)(in_RSI + (local_40 * in_stack_00000008 + local_38) * 4) = iVar1;
        }
        *(float *)(in_RDI + (local_40 * in_stack_00000008 + local_38) * 4) =
             (float)((double)local_58 / 76.0);
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int mapApproxHeight(float *y, int *ids, const Generator *g, const SurfaceNoise *sn,
    int x, int z, int w, int h)
{
    if (g->dim == DIM_NETHER)
        return 127;

    if (g->dim == DIM_END)
    {
        if (g->mc <= MC_1_8)
            return 1;
        return mapEndSurfaceHeight(y, &g->en, sn, x, z, w, h, 4, 0);
    }

    if (g->mc >= MC_1_18)
    {
        if (g->bn.nptype != -1 && g->bn.nptype != NP_DEPTH)
            return 1;
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int flags = 0;//SAMPLE_NO_SHIFT;
                int64_t np[6];
                int id = sampleBiomeNoise(&g->bn, np, x+i, 0, z+j, 0, flags);
                if (ids)
                    ids[j*w+i] = id;
                y[j*w+i] = np[NP_DEPTH] / 76.0;
            }
        }
        return 0;
    }
    else if (g->mc <= MC_B1_7)
    {
        SurfaceNoiseBeta snb; // TODO: merge SurfaceNoise and SurfaceNoiseBeta?
        initSurfaceNoiseBeta(&snb, g->seed);
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int samplex = (x + i) * 4 + 2;
                int samplez = (z + j) * 4 + 2;
                // TODO: properly implement beta surface finder
                y[j*w+i] = approxSurfaceBeta(&g->bnb, &snb, samplex, samplez);
            }
        }
        return 0;
    }

    const float biome_kernel[25] = { // with 10 / (sqrt(i**2 + j**2) + 0.2)
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        4.545454545, 8.333333333, 50.00000000, 8.333333333, 4.545454545,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
    };

    double *depth = (double*) malloc(sizeof(double) * 2 * w * h);
    double *scale = depth + w * h;
    int64_t i, j;
    int ii, jj;

    Range r = {4, x-2, z-2, w+5, h+5, 0, 1};
    int *cache = allocCache(g, r);
    genBiomes(g, cache, r);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            double d0, s0;
            double wt = 0, ws = 0, wd = 0;
            int id0 = cache[(j+2)*r.sx + (i+2)];
            getBiomeDepthAndScale(id0, &d0, &s0, 0);

            for (jj = 0; jj < 5; jj++)
            {
                for (ii = 0; ii < 5; ii++)
                {
                    double d, s;
                    int id = cache[(j+jj)*r.sx + (i+ii)];
                    getBiomeDepthAndScale(id, &d, &s, 0);
                    float weight = biome_kernel[jj*5+ii] / (d + 2);
                    if (d > d0)
                        weight *= 0.5;
                    ws += s * weight;
                    wd += d * weight;
                    wt += weight;
                }
            }
            ws /= wt;
            wd /= wt;
            ws = ws * 0.9 + 0.1;
            wd = (wd * 4.0 - 1) / 8;
            ws = 96 / ws;
            wd = wd * 17./64;
            depth[j*w+i] = wd;
            scale[j*w+i] = ws;
            if (ids)
                ids[j*w+i] = id0;
        }
    }
    free(cache);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int px = x+i, pz = z+j;
            double off = sampleOctaveAmp(&sn->octdepth, px*200, 10, pz*200, 1, 0, 1);
            off *= 65535./8000;
            if (off < 0) off = -0.3 * off;
            off = off * 3 - 2;
            if (off > 1) off = 1;
            off *= 17./64;
            if (off < 0) off *= 1./28;
            else off *= 1./40;

            double vmin = 0, vmax = 0;
            int ytest = 8, ymin = 0, ymax = 32;
            do
            {
                double v[2];
                int k;
                for (k = 0; k < 2; k++)
                {
                    int py = ytest + k;
                    double n0 = sampleSurfaceNoise(sn, px, py, pz);
                    double fall = 1 - 2 * py / 32.0 + off - 0.46875;
                    fall = scale[j*w+i] * (fall + depth[j*w+i]);
                    n0 += (fall > 0 ? 4*fall : fall);
                    v[k] = n0;
                    if (n0 >= 0 && py > ymin)
                    {
                        ymin = py;
                        vmin = n0;
                    }
                    if (n0 < 0 && py < ymax)
                    {
                        ymax = py;
                        vmax = n0;
                    }
                }
                double dy = v[0] / (v[0] - v[1]);
                dy = (dy <= 0 ? floor(dy) : ceil(dy)); // round away from zero
                ytest += (int) dy;
                if (ytest <= ymin) ytest = ymin+1;
                if (ytest >= ymax) ytest = ymax-1;
            }
            while (ymax - ymin > 1);

            y[j*w+i] = 8 * (vmin / (double)(vmin - vmax) + ymin);
        }
    }
    free(depth);
    return 0;
}